

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void scale_mappos_down(mappos16_t *in,mappos8_t *out)

{
  uint8_t iters;
  uint8_t *pcoordout;
  uint16_t *pcoordin;
  mappos8_t *out_local;
  mappos16_t *in_local;
  
  iters = '\x03';
  pcoordout = &out->u;
  pcoordin = &in->u;
  do {
    *pcoordout = (uint8_t)((int)(*pcoordin + 4) >> 3);
    iters = iters + 0xff;
    pcoordout = pcoordout + 1;
    pcoordin = pcoordin + 1;
  } while (iters != '\0');
  return;
}

Assistant:

void scale_mappos_down(const mappos16_t *in, mappos8_t *out)
{
  const uint16_t *pcoordin;  /* was HL */
  uint8_t        *pcoordout; /* was DE */
  uint8_t         iters;     /* was B */

  assert(in  != NULL);
  assert(out != NULL);

  /* Use knowledge of the structure layout to cast the pointers to array[3]
   * of their respective types. */
  pcoordin  = (const uint16_t *) &in->u;
  pcoordout = (uint8_t *) &out->u;

  iters = 3;
  do
    *pcoordout++ = divround(*pcoordin++);
  while (--iters);
}